

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3OsCurrentTimeInt64(sqlite3_vfs *pVfs,sqlite3_int64 *pTimeOut)

{
  long *in_RSI;
  int *in_RDI;
  long in_FS_OFFSET;
  int rc;
  double r;
  int local_24;
  double local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*in_RDI < 2) || (*(long *)(in_RDI + 0x22) == 0)) {
    local_10 = -NAN;
    local_24 = (**(code **)(in_RDI + 0x1e))(in_RDI,&local_10);
    *in_RSI = (long)(local_10 * 86400000.0);
  }
  else {
    local_24 = (**(code **)(in_RDI + 0x22))(in_RDI,in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_24;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE int sqlite3OsCurrentTimeInt64(sqlite3_vfs *pVfs, sqlite3_int64 *pTimeOut){
  int rc;
  /* IMPLEMENTATION-OF: R-49045-42493 SQLite will use the xCurrentTimeInt64()
  ** method to get the current date and time if that method is available
  ** (if iVersion is 2 or greater and the function pointer is not NULL) and
  ** will fall back to xCurrentTime() if xCurrentTimeInt64() is
  ** unavailable.
  */
  if( pVfs->iVersion>=2 && pVfs->xCurrentTimeInt64 ){
    rc = pVfs->xCurrentTimeInt64(pVfs, pTimeOut);
  }else{
    double r;
    rc = pVfs->xCurrentTime(pVfs, &r);
    *pTimeOut = (sqlite3_int64)(r*86400000.0);
  }
  return rc;
}